

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.h
# Opt level: O2

void __thiscall server::collectservmode::update(collectservmode *this)

{
  token *ptVar1;
  uint i;
  vector<int> resets;
  token local_48;
  
  if ((gamemillis < gamelimit) && (this->notgotbases == false)) {
    resets.buf = (int *)0x0;
    resets.alen = 0;
    resets.ulen = 0;
    i = (this->tokens).ulen;
    while (0 < (int)i) {
      i = i - 1;
      ptVar1 = (this->tokens).buf;
      if (9999 < lastmillis - ptVar1[i].droptime) {
        vector<int>::add(&resets,&ptVar1[i].id);
        vector<server::collectservmode::token>::removeunordered(&local_48,&this->tokens,i);
      }
    }
    if (resets.ulen != 0) {
      sendf(-1,1,"rivi",0x6d,(ulong)(uint)resets.ulen,resets.buf,0xffffffff);
    }
    vector<int>::~vector(&resets);
  }
  return;
}

Assistant:

void update()
    {
        if(gamemillis>=gamelimit || notgotbases) return;
        vector<int> resets;
        loopvrev(tokens)
        {
            token &t = tokens[i];
            if(lastmillis - t.droptime >= EXPIRETOKENTIME)
            {
                resets.add(t.id);
                tokens.removeunordered(i);
            }
        }
        if(resets.length())
            sendf(-1, 1, "rivi", N_EXPIRETOKENS, resets.length(), resets.getbuf(), -1);
    }